

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
SugarConvDsk_DSK_HFE_Test::~SugarConvDsk_DSK_HFE_Test(SugarConvDsk_DSK_HFE_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SugarConvDsk, DSK_HFE)
{
	const std::string filename_to_test = "Arkanoid - Revenge of Doh (1988)(Imagine).dsk";
	const fs::path in_file = fs::path(dump_dir) / filename_to_test;
	std::string out_file = filename_to_test + ".HFE";
	const fs::path out_path = fs::path(out_dir) / out_file;
	
	std::string error_string;
	if (!CompareConversion(in_file.string().c_str(), out_path.string().c_str(), "-o=HFE", error_string))
	{
		FAIL() << error_string;
	}
}